

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

void __thiscall obs::signal<void(int)>::operator()(signal<void(int)> *this,int *args)

{
  bool bVar1;
  slot<void_(int)> *this_00;
  slot<void_(int)> *slot;
  undefined1 local_70 [8];
  iterator __end0;
  iterator __begin0;
  slot_list *__range3;
  int *args_local;
  signal<void_(int)> *this_local;
  
  safe_list<obs::slot<void_(int)>_>::begin
            ((iterator *)&__end0.m_next_iterator,(safe_list<obs::slot<void_(int)>_> *)(this + 8));
  safe_list<obs::slot<void_(int)>_>::end
            ((iterator *)local_70,(safe_list<obs::slot<void_(int)>_> *)(this + 8));
  while( true ) {
    bVar1 = safe_list<obs::slot<void_(int)>_>::iterator::operator!=
                      ((iterator *)&__end0.m_next_iterator,(iterator *)local_70);
    if (!bVar1) break;
    this_00 = safe_list<obs::slot<void_(int)>_>::iterator::operator*
                        ((iterator *)&__end0.m_next_iterator);
    if (this_00 != (slot<void_(int)> *)0x0) {
      slot<void(int)>::operator()((slot<void(int)> *)this_00,args);
    }
    safe_list<obs::slot<void_(int)>_>::iterator::operator++((iterator *)&__end0.m_next_iterator);
  }
  safe_list<obs::slot<void_(int)>_>::iterator::~iterator((iterator *)local_70);
  safe_list<obs::slot<void_(int)>_>::iterator::~iterator((iterator *)&__end0.m_next_iterator);
  return;
}

Assistant:

void operator()(Args2&&...args) {
    for (auto slot : m_slots)
      if (slot)
        (*slot)(std::forward<Args2>(args)...);
  }